

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ConstantValue::convertToByteQueue
          (ConstantValue *__return_storage_ptr__,ConstantValue *this,bool isSigned)

{
  __index_type _Var1;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  variant_alternative_t<6UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *__str;
  size_type sVar5;
  string result;
  SVQueue queue;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_108;
  uint local_100;
  undefined1 local_fc;
  byte local_fb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *local_d8;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_d0;
  SVQueue local_a8;
  
  _Var1 = *(__index_type *)
           ((long)&(this->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0x20);
  if (_Var1 == '\b') {
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)__return_storage_ptr__,
                      (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)this);
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    if (_Var1 == '\x06') {
      __str = std::
              get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        (&this->value);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_f8,__str);
    }
    else {
      if (_Var1 != '\x01') {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->value).
                 super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         + 0x20) = '\0';
        return __return_storage_ptr__;
      }
      convertToStr((ConstantValue *)&local_d0,this);
      std::
      get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                (&local_d0);
      convertToByteQueue();
    }
    local_a8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_a8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_a8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_a8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_a8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_a8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_a8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_a8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_a8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_a8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    local_d8 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)__return_storage_ptr__;
    std::_Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::_M_initialize_map
              ((_Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_a8
               ,0);
    sVar4 = local_f8._M_string_length;
    _Var3._M_p = local_f8._M_dataplus._M_p;
    local_a8.maxBound = 0;
    if (local_f8._M_string_length != 0) {
      sVar5 = 0;
      do {
        local_108 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)_Var3._M_p[sVar5];
        local_100 = 8;
        local_fb = 0;
        local_fc = isSigned;
        SVInt::clearUnusedBits((SVInt *)&local_108);
        std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
        emplace_back<slang::SVInt>
                  (&local_a8.
                    super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,
                   (SVInt *)&local_108);
        if (((0x40 < local_100) || ((local_fb & 1) != 0)) && ((void *)local_108.val != (void *)0x0))
        {
          operator_delete__(local_108.pVal);
        }
        sVar5 = sVar5 + 1;
      } while (sVar4 != sVar5);
    }
    CopyPtr<slang::SVQueue>::CopyPtr<slang::SVQueue>
              ((CopyPtr<slang::SVQueue> *)&local_108,&local_a8);
    __return_storage_ptr__ = (ConstantValue *)local_d8;
    aVar2 = local_108;
    local_108.val = 0;
    *local_d8 = aVar2;
    *(__index_type *)(local_d8 + 4) = '\b';
    CopyPtr<slang::SVQueue>::~CopyPtr((CopyPtr<slang::SVQueue> *)&local_108);
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
              (&local_a8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
  }
  return (ConstantValue *)(anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)__return_storage_ptr__;
}

Assistant:

ConstantValue ConstantValue::convertToByteQueue(bool isSigned) const {
    if (isQueue())
        return *this;

    std::string result;
    if (isInteger())
        result = convertToStr().str();
    else if (isString())
        result = str();
    else
        return nullptr;

    SVQueue queue;
    for (auto ch : result)
        queue.emplace_back(SVInt(8, static_cast<uint64_t>(ch), isSigned));

    return queue;
}